

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

void srunner_add_failure(SRunner *sr,TestResult *tr)

{
  TestResult *tr_local;
  SRunner *sr_local;
  
  check_list_add_end(sr->resultlst,tr);
  sr->stats->n_checked = sr->stats->n_checked + 1;
  if (tr->rtype == CK_FAILURE) {
    sr->stats->n_failed = sr->stats->n_failed + 1;
  }
  else if (tr->rtype == CK_ERROR) {
    sr->stats->n_errors = sr->stats->n_errors + 1;
  }
  return;
}

Assistant:

static void srunner_add_failure(SRunner * sr, TestResult * tr)
{
    check_list_add_end(sr->resultlst, tr);
    sr->stats->n_checked++;     /* count checks during setup, test, and teardown */
    if(tr->rtype == CK_FAILURE)
        sr->stats->n_failed++;
    else if(tr->rtype == CK_ERROR)
        sr->stats->n_errors++;

}